

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

int hts_file_type(char *fname)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  hFILE *hfile;
  htsFormat fmt;
  htsFormat local_30;
  
  sVar3 = strlen(fname);
  iVar1 = strcasecmp(".vcf.gz",fname + (long)(int)sVar3 + -7);
  if (iVar1 == 0) {
    iVar1 = 3;
  }
  else {
    iVar1 = strcasecmp(".vcf",fname + (long)(int)sVar3 + -4);
    if (iVar1 == 0) {
      iVar1 = 2;
    }
    else {
      iVar1 = strcasecmp(".bcf",fname + (long)(int)sVar3 + -4);
      if (iVar1 == 0) {
        iVar1 = 5;
      }
      else {
        uVar2 = (byte)*fname - 0x2d;
        if (uVar2 == 0) {
          uVar2 = (uint)(byte)fname[1];
        }
        if (uVar2 == 0) {
          iVar1 = 8;
        }
        else {
          hfile = hopen(fname,"r");
          if (hfile != (hFILE *)0x0) {
            iVar1 = hts_detect_format(hfile,&local_30);
            if (-1 < iVar1) {
              iVar1 = hclose(hfile);
              if (iVar1 < 0) {
                return 0;
              }
              if (local_30.format == bcf) {
                iVar1 = 5;
              }
              else {
                if (local_30.format != vcf) {
                  return 0;
                }
                iVar1 = 3;
              }
              return iVar1 - (uint)(local_30.compression == no_compression);
            }
            hclose_abruptly(hfile);
          }
          iVar1 = 0;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int hts_file_type(const char *fname)
{
    int len = strlen(fname);
    if ( !strcasecmp(".vcf.gz",fname+len-7) ) return FT_VCF_GZ;
    if ( !strcasecmp(".vcf",fname+len-4) ) return FT_VCF;
    if ( !strcasecmp(".bcf",fname+len-4) ) return FT_BCF_GZ;
    if ( !strcmp("-",fname) ) return FT_STDIN;

    hFILE *f = hopen(fname, "r");
    if (f == NULL) return 0;

    htsFormat fmt;
    if (hts_detect_format(f, &fmt) < 0) { hclose_abruptly(f); return 0; }
    if (hclose(f) < 0) return 0;

    switch (fmt.format) {
    case vcf: return (fmt.compression == no_compression)? FT_VCF : FT_VCF_GZ;
    case bcf: return (fmt.compression == no_compression)? FT_BCF : FT_BCF_GZ;
    default:  return 0;
    }
}